

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_expression_classes.hpp
# Opt level: O2

void __thiscall
remora::
matrix_matrix_prod<remora::dense_triangular_proxy<double_const,remora::column_major,remora::triangular_tag<true,false>,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>>
::
plus_assign_to<remora::dense_matrix_adaptor<double,remora::column_major,remora::continuous_dense_tag,remora::cpu_tag>>
          (matrix_matrix_prod<remora::dense_triangular_proxy<double_const,remora::column_major,remora::triangular_tag<true,false>,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>>
           *this,matrix_expression<remora::dense_matrix_adaptor<double,_remora::column_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
                 *X)

{
  type temp;
  multiply_and_add<double> multiply;
  matrix<double,remora::column_major,remora::cpu_tag> local_60 [16];
  _Vector_base<double,_std::allocator<double>_> local_50;
  multiply_and_add<double> local_38;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  undefined8 local_20;
  
  matrix<double,remora::column_major,remora::cpu_tag>::
  matrix<remora::dense_matrix_adaptor<double_const,remora::column_major,remora::continuous_dense_tag,remora::cpu_tag>>
            (local_60,(matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::column_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
                       *)(this + 0x20));
  local_38.scalar = *(double *)this;
  local_20 = *(undefined8 *)(this + 0x18);
  local_30 = *(undefined4 *)(this + 8);
  uStack_2c = *(undefined4 *)(this + 0xc);
  uStack_28 = *(undefined4 *)(this + 0x10);
  uStack_24 = *(undefined4 *)(this + 0x14);
  bindings::
  trmm_impl<remora::dense_matrix_adaptor<double_const,remora::column_major,remora::dense_tag,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::triangular_tag<true,false>>
            (&local_38,local_60);
  local_38.scalar = *(double *)(this + 0x40);
  kernels::
  assign<remora::device_traits<remora::cpu_tag>::multiply_and_add<double>,remora::dense_matrix_adaptor<double,remora::column_major,remora::continuous_dense_tag,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::cpu_tag>
            (X,(matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                *)local_60,&local_38);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_50);
  return;
}

Assistant:

void plus_assign_to(matrix_expression<MatX, device_type>& X, triangular_structure, dense_tag )const{
		//computation of trmm is in-place so we need a temporary for plus-assign.
		typename matrix_temporary<MatX>::type temp = m_rhs;
		kernels::trmm<MatA::orientation::is_upper, MatA::orientation::is_unit>(m_lhs.to_dense(), temp);
		
		//perform plus-assignment of temporary
		typename device_traits<device_type>:: template multiply_and_add<value_type> multiply(m_alpha);
		kernels::assign(X, temp, multiply);
	}